

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockComparatorCopierTest.cpp
# Opt level: O0

void __thiscall
TEST_MockComparatorCopierTest_installComparatorWorksHierarchicalOnBothExistingAndDynamicallyCreatedMockSupports_Test
::testBody(TEST_MockComparatorCopierTest_installComparatorWorksHierarchicalOnBothExistingAndDynamicallyCreatedMockSupports_Test
           *this)

{
  int iVar1;
  MockSupport *pMVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  SimpleString local_188;
  SimpleString local_178;
  SimpleString local_168;
  SimpleString local_158;
  SimpleString local_148;
  SimpleString local_138;
  SimpleString local_128;
  SimpleString local_118;
  SimpleString local_108;
  SimpleString local_f8;
  SimpleString local_e8;
  SimpleString local_d8;
  SimpleString local_c8;
  SimpleString local_b8;
  SimpleString local_a8;
  SimpleString local_98;
  SimpleString local_88;
  SimpleString local_78;
  SimpleString local_68;
  SimpleString local_58;
  SimpleString local_48 [2];
  MyTypeForTestingComparator local_28;
  MyTypeForTestingComparator comparator;
  MyTypeForTesting object;
  TEST_MockComparatorCopierTest_installComparatorWorksHierarchicalOnBothExistingAndDynamicallyCreatedMockSupports_Test
  *this_local;
  
  MyTypeForTesting::MyTypeForTesting((MyTypeForTesting *)&comparator,1);
  MyTypeForTestingComparator::MyTypeForTestingComparator(&local_28);
  SimpleString::SimpleString(local_48,"existing");
  mock(local_48,(MockFailureReporter *)0x0);
  SimpleString::~SimpleString(local_48);
  SimpleString::SimpleString(&local_58,"");
  pMVar2 = mock(&local_58,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_68,"MyTypeForTesting");
  (*pMVar2->_vptr_MockSupport[0x2c])(pMVar2,&local_68,&local_28);
  SimpleString::~SimpleString(&local_68);
  SimpleString::~SimpleString(&local_58);
  SimpleString::SimpleString(&local_78,"existing");
  pMVar2 = mock(&local_78,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_88,"function");
  iVar1 = (*pMVar2->_vptr_MockSupport[3])(pMVar2,&local_88);
  SimpleString::SimpleString(&local_98,"MyTypeForTesting");
  SimpleString::SimpleString(&local_a8,"parameterName");
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x28))
            ((long *)CONCAT44(extraout_var,iVar1),&local_98,&local_a8,&comparator);
  SimpleString::~SimpleString(&local_a8);
  SimpleString::~SimpleString(&local_98);
  SimpleString::~SimpleString(&local_88);
  SimpleString::~SimpleString(&local_78);
  SimpleString::SimpleString(&local_b8,"existing");
  pMVar2 = mock(&local_b8,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_c8,"function");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_c8);
  SimpleString::SimpleString(&local_d8,"MyTypeForTesting");
  SimpleString::SimpleString(&local_e8,"parameterName");
  (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x20))
            ((long *)CONCAT44(extraout_var_00,iVar1),&local_d8,&local_e8,&comparator);
  SimpleString::~SimpleString(&local_e8);
  SimpleString::~SimpleString(&local_d8);
  SimpleString::~SimpleString(&local_c8);
  SimpleString::~SimpleString(&local_b8);
  SimpleString::SimpleString(&local_f8,"dynamic");
  pMVar2 = mock(&local_f8,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_108,"function");
  iVar1 = (*pMVar2->_vptr_MockSupport[3])(pMVar2,&local_108);
  SimpleString::SimpleString(&local_118,"MyTypeForTesting");
  SimpleString::SimpleString(&local_128,"parameterName");
  (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar1) + 0x28))
            ((long *)CONCAT44(extraout_var_01,iVar1),&local_118,&local_128,&comparator);
  SimpleString::~SimpleString(&local_128);
  SimpleString::~SimpleString(&local_118);
  SimpleString::~SimpleString(&local_108);
  SimpleString::~SimpleString(&local_f8);
  SimpleString::SimpleString(&local_138,"dynamic");
  pMVar2 = mock(&local_138,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_148,"function");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_148);
  SimpleString::SimpleString(&local_158,"MyTypeForTesting");
  SimpleString::SimpleString(&local_168,"parameterName");
  (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar1) + 0x20))
            ((long *)CONCAT44(extraout_var_02,iVar1),&local_158,&local_168,&comparator);
  SimpleString::~SimpleString(&local_168);
  SimpleString::~SimpleString(&local_158);
  SimpleString::~SimpleString(&local_148);
  SimpleString::~SimpleString(&local_138);
  SimpleString::SimpleString(&local_178,"");
  pMVar2 = mock(&local_178,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x25])();
  SimpleString::~SimpleString(&local_178);
  SimpleString::SimpleString(&local_188,"");
  pMVar2 = mock(&local_188,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x2f])();
  SimpleString::~SimpleString(&local_188);
  MyTypeForTestingComparator::~MyTypeForTestingComparator(&local_28);
  MyTypeForTesting::~MyTypeForTesting((MyTypeForTesting *)&comparator);
  return;
}

Assistant:

TEST(MockComparatorCopierTest, installComparatorWorksHierarchicalOnBothExistingAndDynamicallyCreatedMockSupports)
{
    MyTypeForTesting object(1);
    MyTypeForTestingComparator comparator;

    mock("existing");
    mock().installComparator("MyTypeForTesting", comparator);
    mock("existing").expectOneCall("function").withParameterOfType("MyTypeForTesting", "parameterName", &object);
    mock("existing").actualCall("function").withParameterOfType("MyTypeForTesting", "parameterName", &object);
    mock("dynamic").expectOneCall("function").withParameterOfType("MyTypeForTesting", "parameterName", &object);
    mock("dynamic").actualCall("function").withParameterOfType("MyTypeForTesting", "parameterName", &object);

    mock().checkExpectations();
    mock().removeAllComparatorsAndCopiers();
}